

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

TEXTURE_FORMAT Diligent::TypelessFormatToUnorm(TEXTURE_FORMAT Fmt)

{
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,Fmt) < 0x49) {
    if (CONCAT22(in_register_0000003a,Fmt) < 0x30) {
      if (CONCAT22(in_register_0000003a,Fmt) == 9) {
        return TEX_FORMAT_RGBA16_UNORM;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x1b) {
        return TEX_FORMAT_RGBA8_UNORM;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x21) {
        return TEX_FORMAT_RG16_UNORM;
      }
    }
    else if (CONCAT22(in_register_0000003a,Fmt) < 0x3c) {
      if (CONCAT22(in_register_0000003a,Fmt) == 0x30) {
        return TEX_FORMAT_RG8_UNORM;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x35) {
        return TEX_FORMAT_R16_UNORM;
      }
    }
    else {
      if (CONCAT22(in_register_0000003a,Fmt) == 0x3c) {
        return TEX_FORMAT_R8_UNORM;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x46) {
        return TEX_FORMAT_BC1_UNORM;
      }
    }
  }
  else {
    switch(CONCAT22(in_register_0000003a,Fmt)) {
    case 0x49:
      return TEX_FORMAT_BC2_UNORM;
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
      break;
    case 0x4c:
      return TEX_FORMAT_BC3_UNORM;
    case 0x4f:
      return TEX_FORMAT_BC4_UNORM;
    case 0x52:
      return TEX_FORMAT_BC5_UNORM;
    default:
      if (CONCAT22(in_register_0000003a,Fmt) == 0x5a) {
        return TEX_FORMAT_BGRA8_UNORM;
      }
      if (CONCAT22(in_register_0000003a,Fmt) == 0x5c) {
        return TEX_FORMAT_BGRX8_UNORM;
      }
    }
  }
  return Fmt;
}

Assistant:

TEXTURE_FORMAT TypelessFormatToUnorm(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_R8_TYPELESS:
            return TEX_FORMAT_R8_UNORM;

        case TEX_FORMAT_RG8_TYPELESS:
            return TEX_FORMAT_RG8_UNORM;

        case TEX_FORMAT_RGBA8_TYPELESS:
            return TEX_FORMAT_RGBA8_UNORM;

        case TEX_FORMAT_BGRA8_TYPELESS:
            return TEX_FORMAT_BGRA8_UNORM;

        case TEX_FORMAT_BGRX8_TYPELESS:
            return TEX_FORMAT_BGRX8_UNORM;

        case TEX_FORMAT_R16_TYPELESS:
            return TEX_FORMAT_R16_UNORM;

        case TEX_FORMAT_RG16_TYPELESS:
            return TEX_FORMAT_RG16_UNORM;

        case TEX_FORMAT_RGBA16_TYPELESS:
            return TEX_FORMAT_RGBA16_UNORM;

        case TEX_FORMAT_BC1_TYPELESS:
            return TEX_FORMAT_BC1_UNORM;

        case TEX_FORMAT_BC2_TYPELESS:
            return TEX_FORMAT_BC2_UNORM;

        case TEX_FORMAT_BC3_TYPELESS:
            return TEX_FORMAT_BC3_UNORM;

        case TEX_FORMAT_BC4_TYPELESS:
            return TEX_FORMAT_BC4_UNORM;

        case TEX_FORMAT_BC5_TYPELESS:
            return TEX_FORMAT_BC5_UNORM;

        default:
            return Fmt;
    }
}